

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BER.h
# Opt level: O3

void __thiscall SortableOIDType::~SortableOIDType(SortableOIDType *this)

{
  pointer puVar1;
  pointer puVar2;
  pointer pcVar3;
  
  (this->super_OIDType).super_BER_CONTAINER._vptr_BER_CONTAINER =
       (_func_int **)&PTR__SortableOIDType_00114f08;
  puVar1 = (this->sortingMap).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  (this->super_OIDType).super_BER_CONTAINER._vptr_BER_CONTAINER =
       (_func_int **)&PTR__OIDType_00115658;
  puVar2 = (this->super_OIDType).data.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  pcVar3 = (this->super_OIDType)._value._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->super_OIDType)._value.field_2) {
    operator_delete(pcVar3);
  }
  operator_delete(this);
  return;
}

Assistant:

explicit SortableOIDType(const std::string& value): OIDType(value), sortingMap(generateSortingMap()){}